

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

Graph * Omega_h::edges_across_tets(Graph *__return_storage_ptr__,Adj *r2e,Adj *e2r)

{
  size_type *psVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined8 uVar7;
  Alloc *pAVar8;
  Graph *pGVar9;
  long *plVar10;
  undefined8 *puVar11;
  Alloc **__dest;
  long lVar12;
  Alloc *pAVar13;
  ulong *puVar14;
  long lVar15;
  int iVar16;
  Alloc *pAVar17;
  byte bVar18;
  int iVar19;
  ulong uVar20;
  size_t sVar21;
  bool bVar22;
  bool bVar23;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Write<int> ee2e;
  size_type __dnew;
  type f;
  Read<signed_char> e2er_codes;
  LOs er2r;
  LOs e2er;
  LOs re2e;
  LOs e2ee;
  ScopedTimer local_21a;
  ScopedTimer local_219;
  undefined1 local_218 [32];
  Alloc *local_1f8;
  void *local_1f0;
  Alloc *local_1e8;
  void *local_1e0;
  Alloc *local_1d8;
  void *local_1d0;
  Alloc **local_1c0;
  Alloc *local_1b8;
  Alloc *local_1b0 [2];
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  long lStack_188;
  void *local_180;
  Alloc *local_178;
  Alloc *local_170;
  Alloc *local_168;
  Alloc *local_160;
  Alloc *local_158;
  Write<int> local_150;
  Alloc *local_140;
  long local_138;
  undefined1 local_130 [24];
  undefined1 local_118 [8];
  Alloc *local_110;
  void *local_108;
  undefined1 local_100 [32];
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  void *pvStack_c8;
  Write<int> local_c0;
  Alloc *local_b0;
  void *local_a8;
  Alloc *local_a0;
  Alloc *local_98;
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  Alloc *local_68;
  size_t local_60;
  Graph *local_58;
  Read<signed_char> local_50;
  Alloc *local_40;
  void *local_38;
  
  local_1a0 = &local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  pAVar17 = (Alloc *)(plVar10 + 2);
  if ((Alloc *)*plVar10 == pAVar17) {
    local_100._0_8_ = pAVar17->size;
    local_100._8_8_ = plVar10[3];
    local_110 = (Alloc *)local_100;
  }
  else {
    local_100._0_8_ = pAVar17->size;
    local_110 = (Alloc *)*plVar10;
  }
  local_108 = (void *)plVar10[1];
  *plVar10 = (long)pAVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c0,3,0x235);
  pAVar17 = (Alloc *)0xf;
  if (local_110 != (Alloc *)local_100) {
    pAVar17 = (Alloc *)local_100._0_8_;
  }
  if (pAVar17 < (Alloc *)((long)local_1b8 + (long)local_108)) {
    pAVar17 = (Alloc *)0xf;
    if (local_1c0 != local_1b0) {
      pAVar17 = local_1b0[0];
    }
    if (pAVar17 < (Alloc *)((long)local_1b8 + (long)local_108)) goto LAB_001d3262;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_001d3262:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_1c0);
  }
  local_218._0_8_ = local_218 + 0x10;
  psVar1 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar1) {
    local_218._16_8_ = *psVar1;
    local_218._24_8_ = puVar11[3];
  }
  else {
    local_218._16_8_ = *psVar1;
    local_218._0_8_ = (size_type *)*puVar11;
  }
  local_218._8_8_ = puVar11[1];
  *puVar11 = psVar1;
  puVar11[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("edges_across_tets",(char *)local_218._0_8_);
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&local_1b0[0]->size + 1));
  }
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,(ulong)((long)(size_t *)local_100._0_8_ + 1));
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  local_80 = (r2e->super_Graph).ab2b.write_.shared_alloc_.alloc;
  local_218._0_8_ = local_218 + 0x10;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  pvVar4 = (r2e->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_90 = (e2r->super_Graph).a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  pAVar17 = local_90;
  local_180 = (e2r->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
  local_a0 = (e2r->super_Graph).ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0 = (Alloc *)(local_a0->size * 8 + 1);
    }
    else {
      local_a0->use_count = local_a0->use_count + 1;
    }
  }
  pAVar13 = (Alloc *)(e2r->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
  local_b0 = (e2r->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  pvVar5 = (e2r->codes).write_.shared_alloc_.direct_ptr;
  if (((ulong)local_90 & 1) == 0) {
    local_60 = local_90->size;
  }
  else {
    local_60 = (ulong)local_90 >> 3;
  }
  bVar22 = local_90 != (Alloc *)0x0;
  bVar23 = ((ulong)local_90 & 7) == 0;
  local_40 = local_90;
  if (bVar23 && bVar22) {
    if (entering_parallel == '\x01') {
      local_40 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  if (((ulong)local_a0 & 1) == 0) {
    sVar21 = local_a0->size;
  }
  else {
    sVar21 = (ulong)local_a0 >> 3;
  }
  local_178 = local_a0;
  local_170 = local_80;
  local_160 = local_40;
  local_158 = local_b0;
  local_a8 = pvVar5;
  local_98 = pAVar13;
  local_88 = local_180;
  local_78 = pvVar4;
  local_58 = __return_storage_ptr__;
  local_38 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"edge edges to edges","");
  Write<int>::Write(&local_150,(LO)(sVar21 >> 2),(string *)local_218);
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  pvVar6 = local_150.shared_alloc_.direct_ptr;
  local_110 = pAVar17;
  if (bVar23 && bVar22) {
    if (entering_parallel == '\x01') {
      local_110 = (Alloc *)(pAVar17->size * 8 + 1);
    }
    else {
      pAVar17->use_count = pAVar17->use_count + 1;
    }
  }
  local_108 = local_180;
  local_100._0_8_ = local_178;
  if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._0_8_ = local_178->size * 8 + 1;
    }
    else {
      local_178->use_count = local_178->use_count + 1;
    }
  }
  local_100._16_8_ = local_158;
  if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._16_8_ = local_158->size * 8 + 1;
    }
    else {
      local_158->use_count = local_158->use_count + 1;
    }
  }
  local_e0 = local_170;
  if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)(local_170->size * 8 + 1);
    }
    else {
      local_170->use_count = local_170->use_count + 1;
    }
  }
  local_d0 = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0 = (Alloc *)((local_150.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.shared_alloc_.alloc)->use_count = (local_150.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_c8 = local_150.shared_alloc_.direct_ptr;
  local_1c0 = local_1b0;
  local_140 = (Alloc *)0x5d;
  local_178 = (Alloc *)local_100._0_8_;
  local_170 = local_e0;
  local_168 = local_d0;
  local_100._8_8_ = pAVar13;
  local_100._24_8_ = pvVar5;
  local_d8 = pvVar4;
  local_70 = (Alloc *)local_100._16_8_;
  local_68 = local_110;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_1c0,(ulong)&local_140);
  pAVar17 = local_140;
  local_1b0[0] = local_140;
  local_1c0 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_1b8 = pAVar17;
  *(undefined1 *)((long)__dest + (long)pAVar17) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  puVar14 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar14) {
    local_190 = *puVar14;
    lStack_188 = plVar10[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *puVar14;
    local_1a0 = (ulong *)*plVar10;
  }
  local_198 = plVar10[1];
  *plVar10 = (long)puVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_140 = (Alloc *)local_130;
  std::__cxx11::string::_M_construct((ulong)&local_140,'\x02');
  *(undefined2 *)&local_140->size = 0x3438;
  uVar20 = 0xf;
  if (local_1a0 != &local_190) {
    uVar20 = local_190;
  }
  if (uVar20 < (ulong)(local_138 + local_198)) {
    uVar20 = 0xf;
    if (local_140 != (Alloc *)local_130) {
      uVar20 = local_130._0_8_;
    }
    if ((ulong)(local_138 + local_198) <= uVar20) {
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_140,0,(char *)0x0,(ulong)local_1a0);
      goto LAB_001d38ca;
    }
  }
  plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_140);
LAB_001d38ca:
  local_218._0_8_ = local_218 + 0x10;
  pAVar17 = (Alloc *)(plVar10 + 2);
  if ((Alloc *)*plVar10 == pAVar17) {
    local_218._16_8_ = pAVar17->size;
    local_218._24_8_ = plVar10[3];
  }
  else {
    local_218._16_8_ = pAVar17->size;
    local_218._0_8_ = (Alloc *)*plVar10;
  }
  local_218._8_8_ = plVar10[1];
  *plVar10 = (long)pAVar17;
  plVar10[1] = 0;
  *(undefined1 *)&pAVar17->size = 0;
  begin_code("parallel_for",(char *)local_218._0_8_);
  if ((Alloc *)local_218._0_8_ != (Alloc *)(local_218 + 0x10)) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
  }
  if (local_140 != (Alloc *)local_130) {
    operator_delete(local_140,local_130._0_8_ + 1);
  }
  uVar20 = local_60 >> 2;
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  pAVar17 = local_160;
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,(ulong)((long)&local_1b0[0]->size + 1));
  }
  iVar19 = (int)uVar20;
  if (1 < iVar19) {
    local_218._0_8_ = local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      local_218._0_8_ = local_68->size * 8 + 1;
    }
    local_218._8_8_ = local_180;
    local_218._16_8_ = local_178;
    if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
      local_218._16_8_ = local_178->size * 8 + 1;
    }
    local_1f8 = local_70;
    if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
      local_1f8 = (Alloc *)(local_70->size * 8 + 1);
    }
    local_1e8 = local_170;
    if (((ulong)local_170 & 7) == 0 && local_170 != (Alloc *)0x0) {
      local_1e8 = (Alloc *)(local_170->size * 8 + 1);
    }
    local_1d8 = local_168;
    local_1d0 = pvVar6;
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      local_168->use_count = local_168->use_count + -1;
      local_1d8 = (Alloc *)(local_168->size * 8 + 1);
    }
    local_d0 = (Alloc *)0x0;
    pvStack_c8 = (void *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      iVar16 = *(int *)((long)local_180 + lVar12 * 4);
      lVar15 = (long)iVar16;
      iVar3 = *(int *)((long)local_180 + lVar12 * 4 + 4);
      if (iVar16 < iVar3) {
        do {
          bVar18 = *(char *)((long)pvVar5 + lVar15) >> 3;
          iVar16 = -1;
          if (bVar18 < 6) {
            iVar16 = *(int *)(&DAT_00442bb8 + (ulong)bVar18 * 4);
          }
          *(undefined4 *)((long)pvVar6 + lVar15 * 4) =
               *(undefined4 *)
                ((long)pvVar4 +
                ((long)iVar16 + (long)*(int *)((long)&pAVar13->size + lVar15 * 4) * 6) * 4);
          lVar15 = lVar15 + 1;
        } while (iVar3 != lVar15);
      }
      lVar12 = lVar12 + 1;
    } while (iVar19 + -1 != (int)lVar12);
    local_218._24_8_ = pAVar13;
    local_1f0 = pvVar5;
    local_1e0 = pvVar4;
    edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_218);
  }
  ScopedTimer::~ScopedTimer(&local_219);
  pGVar9 = local_58;
  pAVar13 = local_158;
  local_130._16_8_ = pAVar17;
  bVar22 = ((ulong)pAVar17 & 7) == 0;
  if (bVar22 && pAVar17 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_130._16_8_ = pAVar17->size * 8 + 1;
    }
    else {
      pAVar17->use_count = pAVar17->use_count + 1;
    }
  }
  local_118 = (undefined1  [8])local_180;
  local_c0.shared_alloc_.alloc = local_150.shared_alloc_.alloc;
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0.shared_alloc_.alloc = (Alloc *)((local_150.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_150.shared_alloc_.alloc)->use_count = (local_150.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_c0.shared_alloc_.direct_ptr = local_150.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_50,&local_c0);
  Adj::Adj((Adj *)local_218,(LOs *)(local_130 + 0x10),(LOs *)&local_50);
  (pGVar9->a2ab).write_.shared_alloc_.alloc = (Alloc *)local_218._0_8_;
  (pGVar9->a2ab).write_.shared_alloc_.direct_ptr = (void *)local_218._8_8_;
  if (((local_218._0_8_ & 7) == 0 && (Alloc *)local_218._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_218._0_8_ + 0x30) = *(int *)(local_218._0_8_ + 0x30) + -1;
    (pGVar9->a2ab).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_218._0_8_ * 8 + 1);
  }
  local_218._0_8_ = (pointer)0x0;
  local_218._8_8_ = (void *)0x0;
  (pGVar9->ab2b).write_.shared_alloc_.alloc = (Alloc *)local_218._16_8_;
  (pGVar9->ab2b).write_.shared_alloc_.direct_ptr = (void *)local_218._24_8_;
  if (((local_218._16_8_ & 7) == 0 && (Alloc *)local_218._16_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_218._16_8_ + 0x30) = *(int *)(local_218._16_8_ + 0x30) + -1;
    (pGVar9->ab2b).write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_218._16_8_ * 8 + 1);
  }
  local_218._16_8_ = 0;
  local_218._24_8_ = 0;
  Adj::~Adj((Adj *)local_218);
  if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
      local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_50.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
      operator_delete(local_50.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar8 = local_c0.shared_alloc_.alloc;
  if (((ulong)local_c0.shared_alloc_.alloc & 7) == 0 && local_c0.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_c0.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_c0.shared_alloc_.alloc);
      operator_delete(pAVar8,0x48);
    }
  }
  uVar7 = local_130._16_8_;
  if ((local_130._16_8_ & 7) == 0 && (Alloc *)local_130._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_130._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_130._16_8_);
      operator_delete((void *)uVar7,0x48);
    }
  }
  edges_across_tets(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)&local_110);
  if (((ulong)local_150.shared_alloc_.alloc & 7) == 0 &&
      local_150.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_150.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_150.shared_alloc_.alloc);
      operator_delete(local_150.shared_alloc_.alloc,0x48);
    }
  }
  if (bVar22 && pAVar17 != (Alloc *)0x0) {
    piVar2 = &pAVar17->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar17);
      operator_delete(pAVar17,0x48);
      pAVar13 = local_b0;
    }
  }
  if ((pAVar13 != (Alloc *)0x0) && (((ulong)pAVar13 & 7) == 0)) {
    piVar2 = &pAVar13->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(pAVar13);
      operator_delete(pAVar13,0x48);
    }
  }
  pAVar17 = local_a0;
  if (((ulong)local_a0 & 7) == 0 && local_a0 != (Alloc *)0x0) {
    piVar2 = &local_a0->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a0);
      operator_delete(pAVar17,0x48);
    }
  }
  pAVar17 = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    piVar2 = &local_90->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_90);
      operator_delete(pAVar17,0x48);
    }
  }
  pAVar17 = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    piVar2 = &local_80->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_80);
      operator_delete(pAVar17,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_21a);
  return pGVar9;
}

Assistant:

Graph edges_across_tets(Adj const r2e, Adj const e2r) {
  OMEGA_H_TIME_FUNCTION;
  auto const re2e = r2e.ab2b;
  auto const e2er = e2r.a2ab;
  auto const er2r = e2r.ab2b;
  auto const e2er_codes = e2r.codes;
  auto const ne = e2er.size() - 1;
  auto const e2ee = e2er;
  Write<LO> ee2e(er2r.size(), "edge edges to edges");
  auto f = OMEGA_H_LAMBDA(LO e) {
    auto const er_begin = e2er[e];
    auto const er_end = e2er[e + 1];
    for (auto er = er_begin; er < er_end; ++er) {
      auto const r = er2r[er];
      auto const e2er_code = e2er_codes[er];
      auto const rre = code_which_down(e2er_code);
      auto const rre_opp = simplex_opposite_template(REGION, EDGE, rre);
      auto const re_begin = r * 6;
      auto const e_opp = re2e[re_begin + rre_opp];
      auto const ee = er;
      ee2e[ee] = e_opp;
    }
  };
  parallel_for(ne, std::move(f));
  return Adj(e2ee, ee2e);
}